

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O3

int32_t conv_mcnpx_pdg2ssw(int32_t c)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int32_t *piVar6;
  long lVar7;
  
  uVar1 = c;
  if (c < 1) {
    uVar1 = -c;
  }
  if ((int)uVar1 < 0x3b9b1849) {
    piVar6 = conv_mcnpx_to_pdg_0to34;
    uVar3 = 0;
    do {
      if (*piVar6 == c) goto LAB_001039eb;
      uVar3 = uVar3 + 1;
      piVar6 = piVar6 + 1;
    } while (uVar3 != 0x23);
    uVar3 = 400;
    lVar7 = 0;
    do {
      if (*(uint *)((long)conv_mcnpx_to_pdg_0to34 + lVar7) == -c) goto LAB_001039eb;
      uVar3 = (ulong)((int)uVar3 + 1);
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x8c);
  }
  uVar3 = 0;
  if (uVar1 + 0xc46535ff < 0x989676) {
    uVar4 = uVar1 / 10 + (uVar1 / 10000) * -1000;
    iVar5 = uVar1 / 10000 + (uVar1 / 10000000) * -1000;
    if (iVar5 - 1U < uVar4 &&
        (uVar1 * -0x33333333 >> 1 | (uint)((uVar1 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a) {
      iVar5 = iVar5 * 1000000;
      iVar2 = iVar5 + -0xf408d;
      if (-1 < c) {
        iVar2 = iVar5 + -0xf421d;
      }
      uVar3 = (ulong)(iVar2 + uVar4 * 1000);
    }
  }
LAB_001039eb:
  return (int32_t)uVar3;
}

Assistant:

int32_t conv_mcnpx_pdg2ssw( int32_t c )
{
  int32_t absc = c < 0 ? -c : c;
  if (absc <= 1000020040) {
    int i;
    for (i = 0; i<35; ++i) {
      if (conv_mcnpx_to_pdg_0to34[i]==c)
        return i;
    }
    for (i = 0; i<35; ++i) {
      if (conv_mcnpx_to_pdg_0to34[i] == -c)
        return 400+i;
    }
  }
  if (absc>1000000000&&absc<=1009999990) {
    //Ions. PDG format for ions is 10LZZZAAAI, where L!=0 indicates strangeness
    //and I!=0 indicates exited nuclei. We only allow L=I=0 ions here.
    int32_t I = absc % 10;//isomer level
    absc/=10;
    int32_t A = absc%1000;
    absc/=1000;
    int32_t Z = absc % 1000;
    assert(absc/1000==100);//L=0 guaranteed by enclosing condition.
    if ( I || !A || !Z || Z>A )
      return 0;
    return (Z-1)*1000000 + A*1000 + ( c<0 ? 435 : 35 );
  }
  return 0;
}